

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int iVar1;
  int __c;
  int __c_00;
  int __c_01;
  char *pcVar2;
  int *__args;
  int local_1c [3];
  
  if (this[0x50] == (FieldDescriptor)0x1) {
    if (*(Descriptor **)(this + 0x68) == (Descriptor *)0x0) {
      pcVar2 = "\a";
      std::vector<int,_std::allocator<int>_>::push_back
                (output,&FileDescriptorProto::kExtensionFieldNumber);
      pcVar2 = index(this,pcVar2,__c_01);
      iVar1 = (int)pcVar2;
      __args = local_1c + 2;
    }
    else {
      Descriptor::GetLocationPath(*(Descriptor **)(this + 0x68),output);
      pcVar2 = "\x06";
      std::vector<int,_std::allocator<int>_>::push_back
                (output,&DescriptorProto::kExtensionFieldNumber);
      pcVar2 = index(this,pcVar2,__c);
      iVar1 = (int)pcVar2;
      __args = local_1c + 1;
    }
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x58),output);
    pcVar2 = "\x02";
    std::vector<int,_std::allocator<int>_>::push_back(output,&DescriptorProto::kFieldFieldNumber);
    pcVar2 = index(this,pcVar2,__c_00);
    iVar1 = (int)pcVar2;
    __args = local_1c;
  }
  *__args = iVar1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,__args);
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (is_extension()) {
    if (extension_scope() == NULL) {
      output->push_back(FileDescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    } else {
      extension_scope()->GetLocationPath(output);
      output->push_back(DescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    }
  } else {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kFieldFieldNumber);
    output->push_back(index());
  }
}